

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib553.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      iVar5 = 0;
      iVar1 = 2;
      lVar6 = 0;
      do {
        iVar2 = curl_msnprintf(buf,0x13ec,"Header%d: ",iVar5);
        memset(buf + iVar2,0x41,5000);
        buf[(long)iVar2 + 5000] = '\0';
        lVar4 = curl_slist_append(lVar6,buf);
        if (lVar4 == 0) goto LAB_001013eb;
        iVar5 = iVar5 + 1;
        lVar6 = lVar4;
      } while (iVar5 != 8);
      lVar4 = curl_slist_append(lVar4,"Expect: ");
      if (((((lVar4 != 0) && (iVar1 = curl_easy_setopt(lVar3,0x2712,URL), lVar6 = lVar4, iVar1 == 0)
            ) && (iVar1 = curl_easy_setopt(lVar3,0x2727,lVar4), iVar1 == 0)) &&
          ((iVar1 = curl_easy_setopt(lVar3,0x2f,1), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar3,0x3c,0xa000), iVar1 == 0)))) &&
         ((iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 == 0 &&
          ((iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar3,0x4e2c,myreadfunc), iVar1 == 0)))))) {
        iVar1 = curl_easy_perform(lVar3);
      }
LAB_001013eb:
      curl_easy_cleanup(lVar3);
      curl_slist_free_all(lVar6);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_FAILED_INIT;
  int i;
  struct curl_slist *headerlist = NULL, *hl;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < NUM_HEADERS; i++) {
    int len = msnprintf(buf, sizeof(buf), "Header%d: ", i);
    memset(&buf[len], 'A', SIZE_HEADERS);
    buf[len + SIZE_HEADERS] = 0; /* zero terminate */
    hl = curl_slist_append(headerlist,  buf);
    if(!hl)
      goto test_cleanup;
    headerlist = hl;
  }

  hl = curl_slist_append(headerlist, "Expect: ");
  if(!hl)
    goto test_cleanup;
  headerlist = hl;

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headerlist);
  test_setopt(curl, CURLOPT_POST, 1L);
#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)POSTLEN);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_READFUNCTION, myreadfunc);

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);

  curl_slist_free_all(headerlist);

  curl_global_cleanup();

  return (int)res;
}